

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  long lVar16;
  long lVar17;
  Allocator *pAVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  Allocator *pAVar22;
  long lVar23;
  undefined8 *puVar24;
  int j;
  Allocator *pAVar25;
  ulong uVar26;
  Allocator *pAVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [32];
  float fVar43;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float tmp [8] [3];
  Mat local_e8;
  float fStack_98;
  undefined8 auStack_94 [3];
  undefined1 auStack_78 [72];
  
  local_e8.cstep = 0;
  local_e8.data = (Allocator *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elempack = 0;
  local_e8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_e8.elemsize._4_4_ = (int)local_e8.refcount;
  local_e8.allocator = (Allocator *)local_e8.data;
  local_e8.dims = (int)local_e8.refcount;
  local_e8.w = local_e8.refcount._4_4_;
  local_e8.c = local_e8.elempack;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_0055a400;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar26 = 0;
    pAVar22 = (Allocator *)local_e8.data;
    do {
      if (0 < inch) {
        iVar19 = inch * 9 * (int)uVar26;
        uVar29 = 0;
        pAVar25 = pAVar22;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar29 * 0x24 + (long)iVar19 * 4 + 0x20);
          lVar30 = 0;
          do {
            auVar34 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0055a590 + lVar30)),
                                    ZEXT416(*(uint *)((long)&DAT_0055a59c + lVar30)),0x10);
            auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)&DAT_0055a5a8 + lVar30)),0x20);
            auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)&DAT_0055a5b4 + lVar30)),0x30);
            auVar49 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0055a594 + lVar30)),
                                    ZEXT416(*(uint *)((long)&DAT_0055a5a0 + lVar30)),0x10);
            auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)((long)&DAT_0055a5ac + lVar30)),0x20);
            auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)((long)&DAT_0055a5b8 + lVar30)),0x30);
            fVar33 = auVar34._0_4_;
            fVar35 = auVar34._4_4_;
            fVar36 = auVar34._8_4_;
            fVar37 = auVar34._12_4_;
            fVar38 = auVar49._0_4_;
            fVar40 = auVar49._4_4_;
            fVar41 = auVar49._8_4_;
            fVar42 = auVar49._12_4_;
            auVar34 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_0055a598 + lVar30)),
                                    ZEXT416(*(uint *)((long)&DAT_0055a5a0 + lVar30 + 4)),0x10);
            auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)&DAT_0055a5b0 + lVar30)),0x20);
            auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)&DAT_0055a5bc + lVar30)),0x30);
            fVar43 = auVar34._0_4_;
            fVar46 = auVar34._4_4_;
            fVar47 = auVar34._8_4_;
            fVar48 = auVar34._12_4_;
            auVar49._0_4_ = fVar38 * fVar2 + fVar33 * fVar1 + fVar43 * fVar3;
            auVar49._4_4_ = fVar40 * fVar2 + fVar35 * fVar1 + fVar46 * fVar3;
            auVar49._8_4_ = fVar41 * fVar2 + fVar36 * fVar1 + fVar47 * fVar3;
            auVar49._12_4_ = fVar42 * fVar2 + fVar37 * fVar1 + fVar48 * fVar3;
            auVar50._0_4_ = fVar38 * fVar5 + fVar33 * fVar4 + fVar43 * fVar6;
            auVar50._4_4_ = fVar40 * fVar5 + fVar35 * fVar4 + fVar46 * fVar6;
            auVar50._8_4_ = fVar41 * fVar5 + fVar36 * fVar4 + fVar47 * fVar6;
            auVar50._12_4_ = fVar42 * fVar5 + fVar37 * fVar4 + fVar48 * fVar6;
            auVar34._0_8_ =
                 CONCAT44(fVar8 * fVar40 + fVar35 * fVar7 + fVar9 * fVar46,
                          fVar8 * fVar38 + fVar33 * fVar7 + fVar9 * fVar43);
            auVar34._8_4_ = fVar8 * fVar41 + fVar36 * fVar7 + fVar9 * fVar47;
            auVar34._12_4_ = fVar8 * fVar42 + fVar37 * fVar7 + fVar9 * fVar48;
            auVar39._16_16_ = auVar50;
            auVar39._0_16_ = auVar49;
            auVar45 = vpermilps_avx(auVar39,auVar15);
            auVar44._16_16_ = auVar49;
            auVar44._0_16_ = auVar50;
            auVar39 = vmovsldup_avx(auVar44);
            auVar39 = vblendps_avx(auVar45,auVar39,0x42);
            auVar45._8_8_ = auVar34._0_8_;
            auVar45._0_8_ = auVar34._0_8_;
            auVar45._16_16_ = auVar34;
            auVar39 = vblendps_avx(auVar39,auVar45,0x24);
            auVar49 = vshufps_avx(auVar49,auVar50,0xff);
            auVar34 = vshufpd_avx(auVar34,auVar34,3);
            auVar34 = vblendps_avx(auVar34,auVar49,6);
            *(undefined1 (*) [16])(auStack_78 + lVar30) = auVar34;
            *(undefined1 (*) [32])((long)auStack_94 + lVar30 + -4) = auVar39;
            lVar30 = lVar30 + 0x30;
          } while (lVar30 != 0x60);
          lVar30 = 0;
          pAVar27 = pAVar25;
          do {
            fVar1 = *(float *)((long)auStack_94 + lVar30 * 0xc + -4);
            uVar10 = *(undefined8 *)((long)auStack_94 + lVar30 * 0xc);
            puVar24 = (undefined8 *)&DAT_0055a594;
            lVar21 = 0;
            do {
              auVar32._0_4_ = (float)*puVar24 * (float)uVar10;
              auVar32._4_4_ = (float)((ulong)*puVar24 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar32._8_8_ = 0;
              auVar34 = vmovshdup_avx(auVar32);
              *(float *)((long)&pAVar27->_vptr_Allocator + lVar21 * 4) =
                   auVar32._0_4_ + fVar1 * *(float *)((long)puVar24 + -4) + auVar34._0_4_;
              lVar21 = lVar21 + 1;
              puVar24 = (undefined8 *)((long)puVar24 + 0xc);
            } while (lVar21 != 8);
            lVar30 = lVar30 + 1;
            pAVar27 = pAVar27 + 4;
          } while (lVar30 != 8);
          uVar29 = uVar29 + 1;
          pAVar25 = (Allocator *)
                    ((long)&pAVar25->_vptr_Allocator +
                    (long)local_e8.w *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar29 != (uint)inch);
      }
      uVar26 = uVar26 + 1;
      pAVar22 = (Allocator *)
                ((long)&pAVar22->_vptr_Allocator +
                local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar26 != (uint)outch);
  }
  iVar19 = inch + 3;
  if (-1 < inch) {
    iVar19 = inch;
  }
  iVar20 = outch + 3;
  if (-1 < outch) {
    iVar20 = outch;
  }
  Mat::create(kernel_tm_pack4,iVar19 >> 2,0x40,iVar20 >> 2,0x40,0x10,(Allocator *)0x0);
  if (3 < outch) {
    iVar19 = kernel_tm_pack4->w;
    pvVar11 = kernel_tm_pack4->data;
    sVar12 = kernel_tm_pack4->elemsize;
    sVar13 = kernel_tm_pack4->cstep;
    uVar26 = 0;
    do {
      lVar21 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      lVar30 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      pAVar22 = (Allocator *)((long)(_func_int ***)local_e8.data + lVar21 * uVar26);
      lVar31 = 0;
      do {
        if (3 < inch) {
          lVar16 = (long)pvVar11 + (long)iVar19 * sVar12 * lVar31 + (uVar26 >> 2) * sVar13 * sVar12;
          pAVar25 = pAVar22;
          lVar28 = 0;
          do {
            lVar23 = 0;
            pAVar27 = pAVar25;
            do {
              lVar17 = lVar16;
              lVar16 = 0;
              pAVar18 = pAVar27;
              do {
                *(undefined4 *)(lVar17 + lVar16) = *(undefined4 *)&pAVar18->_vptr_Allocator;
                pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + lVar21);
                lVar16 = lVar16 + 4;
              } while (lVar16 != 0x10);
              lVar23 = lVar23 + 1;
              pAVar27 = (Allocator *)((long)&pAVar27->_vptr_Allocator + lVar30);
              lVar16 = lVar17 + 0x10;
            } while (lVar23 != 4);
            lVar23 = lVar28 + 7;
            pAVar25 = (Allocator *)((long)&pAVar25->_vptr_Allocator + lVar30 * 4);
            lVar16 = lVar17 + 0x10;
            lVar28 = lVar28 + 4;
          } while (lVar23 < inch);
        }
        lVar31 = lVar31 + 1;
        pAVar22 = (Allocator *)((long)&pAVar22->_vptr_Allocator + 4);
      } while (lVar31 != 0x40);
      uVar29 = uVar26 + 7;
      uVar26 = uVar26 + 4;
    } while (uVar29 < (uint)outch);
  }
  piVar14 = (int *)CONCAT44(local_e8.refcount._4_4_,(int)local_e8.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_e8.data != (Allocator *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = pb-pa-inch/pa-64-outch/pb
    kernel_tm_pack4.create(inch / 4, 64, outch / 4, (size_t)4u * 4 * 4, 4 * 4);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack4.channel(q / 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 3 < inch; p += 4)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}